

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O0

void ncnn::draw_text_c2(uchar *pixels,int w,int h,int stride,char *text,int x,int y,
                       int fontpixelsize,uint color)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  int *piVar4;
  int in_ECX;
  long in_RDI;
  char *in_R8;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  uchar alpha;
  int k;
  uchar *p;
  uchar *palpha;
  int j;
  int xend;
  int xstart;
  int yend;
  int ystart;
  uchar *font_bitmap;
  char ch;
  int i;
  int cursor_y;
  int cursor_x;
  int n;
  uchar *resized_font_bitmap;
  uchar *pen_color;
  int in_stack_000009ec;
  uchar *in_stack_000009f0;
  uchar *in_stack_000009f8;
  int local_94;
  byte *local_90;
  byte *local_88;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  undefined1 *local_58;
  char local_49;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  void *local_38;
  uchar **local_30;
  int local_24;
  char *local_20;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_30 = &p;
  local_24 = in_R9D;
  local_20 = in_R8;
  local_14 = in_ECX;
  local_8 = in_RDI;
  local_38 = operator_new__((long)(in_stack_00000010 * in_stack_00000010 * 2));
  sVar3 = strlen(local_20);
  local_3c = (int)sVar3;
  local_40 = local_24;
  local_44 = in_stack_00000008;
  for (local_48 = 0; local_48 < local_3c; local_48 = local_48 + 1) {
    local_49 = local_20[local_48];
    if (local_49 == '\n') {
      local_40 = local_24;
      local_44 = in_stack_00000010 * 2 + local_44;
    }
    else if (local_49 == ' ') {
      local_40 = in_stack_00000010 + local_40;
    }
    else {
      iVar2 = isprint((int)local_49);
      if (iVar2 != 0) {
        local_58 = mono_font_data + (long)(local_49 + -0x21) * 400;
        resize_bilinear_font(in_stack_000009f8,in_stack_000009f0,in_stack_000009ec);
        local_60 = 0;
        piVar4 = std::max<int>(&local_44,&local_60);
        local_5c = *piVar4;
        local_68 = local_44 + in_stack_00000010 * 2;
        piVar4 = std::min<int>(&local_68,&local_10);
        local_64 = *piVar4;
        local_70 = 0;
        piVar4 = std::max<int>(&local_40,&local_70);
        local_6c = *piVar4;
        local_78 = local_40 + in_stack_00000010;
        piVar4 = std::min<int>(&local_78,&local_c);
        local_74 = *piVar4;
        for (local_7c = local_5c; local_7c < local_64; local_7c = local_7c + 1) {
          local_90 = (byte *)(local_8 + local_14 * local_7c + (long)(local_6c << 1));
          local_88 = (byte *)((long)local_38 +
                             (((long)local_6c + (long)((local_7c - local_44) * in_stack_00000010)) -
                             (long)local_40));
          for (local_94 = local_6c; local_94 < local_74; local_94 = local_94 + 1) {
            bVar1 = *local_88;
            *local_90 = (byte)((long)(int)((uint)*local_90 * (0xff - (uint)bVar1) +
                                          (uint)*(byte *)local_30 * (uint)bVar1) / 0xff);
            local_90[1] = (byte)((long)(int)((uint)local_90[1] * (0xff - (uint)bVar1) +
                                            (uint)*(byte *)((long)local_30 + 1) * (uint)bVar1) /
                                0xff);
            local_90 = local_90 + 2;
            local_88 = local_88 + 1;
          }
        }
        local_40 = in_stack_00000010 + local_40;
      }
    }
  }
  if (local_38 != (void *)0x0) {
    operator_delete__(local_38);
  }
  return;
}

Assistant:

void draw_text_c2(unsigned char* pixels, int w, int h, int stride, const char* text, int x, int y, int fontpixelsize, unsigned int color)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    unsigned char* resized_font_bitmap = new unsigned char[fontpixelsize * fontpixelsize * 2];

    const int n = strlen(text);

    int cursor_x = x;
    int cursor_y = y;
    for (int i = 0; i < n; i++)
    {
        char ch = text[i];

        if (ch == '\n')
        {
            // newline
            cursor_x = x;
            cursor_y += fontpixelsize * 2;
            continue;
        }

        if (ch == ' ')
        {
            cursor_x += fontpixelsize;
            continue;
        }

        if (isprint(ch) != 0)
        {
            const unsigned char* font_bitmap = mono_font_data[ch - '!'];

            // draw resized character
            resize_bilinear_font(font_bitmap, resized_font_bitmap, fontpixelsize);

            const int ystart = std::max(cursor_y, 0);
            const int yend = std::min(cursor_y + fontpixelsize * 2, h);
            const int xstart = std::max(cursor_x, 0);
            const int xend = std::min(cursor_x + fontpixelsize, w);

            for (int j = ystart; j < yend; j++)
            {
                const unsigned char* palpha = resized_font_bitmap + (j - cursor_y) * fontpixelsize + xstart - cursor_x;
                unsigned char* p = pixels + stride * j + xstart * 2;

                for (int k = xstart; k < xend; k++)
                {
                    unsigned char alpha = *palpha++;

                    p[0] = (p[0] * (255 - alpha) + pen_color[0] * alpha) / 255;
                    p[1] = (p[1] * (255 - alpha) + pen_color[1] * alpha) / 255;
                    p += 2;
                }
            }

            cursor_x += fontpixelsize;
        }
    }

    delete[] resized_font_bitmap;
}